

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitterutils.cpp
# Opt level: O2

bool YAML::Utils::WriteTagWithPrefix(ostream_wrapper *out,string *prefix,string *tag)

{
  int iVar1;
  RegEx *pRVar2;
  bool bVar3;
  StringCharSource tagBuffer;
  StringCharSource prefixBuffer;
  StringCharSource local_50;
  StringCharSource local_38;
  
  YAML::operator<<(out,(char (*) [2])0x6e1ac1);
  local_38.m_str = (prefix->_M_dataplus)._M_p;
  local_38.m_size = prefix->_M_string_length;
  local_38.m_offset = 0;
  while (local_38.m_offset < local_38.m_size) {
    pRVar2 = Exp::URI();
    iVar1 = RegEx::Match<YAML::StringCharSource>(pRVar2,&local_38);
    if (iVar1 < 1) {
      return false;
    }
    for (; 0 < iVar1; iVar1 = iVar1 + -1) {
      YAML::operator<<(out,local_38.m_str[local_38.m_offset]);
      local_38.m_offset = local_38.m_offset + 1;
    }
  }
  YAML::operator<<(out,(char (*) [2])0x6e1ac1);
  local_50.m_str = (tag->_M_dataplus)._M_p;
  local_50.m_size = tag->_M_string_length;
  local_50.m_offset = 0;
  while( true ) {
    bVar3 = local_50.m_size <= local_50.m_offset;
    if (bVar3) {
      return bVar3;
    }
    pRVar2 = Exp::Tag();
    iVar1 = RegEx::Match<YAML::StringCharSource>(pRVar2,&local_50);
    if (iVar1 < 1) break;
    for (; 0 < iVar1; iVar1 = iVar1 + -1) {
      YAML::operator<<(out,local_50.m_str[local_50.m_offset]);
      local_50.m_offset = local_50.m_offset + 1;
    }
  }
  return bVar3;
}

Assistant:

bool WriteTagWithPrefix(ostream_wrapper& out, const std::string& prefix,
                        const std::string& tag) {
  out << "!";
  StringCharSource prefixBuffer(prefix.c_str(), prefix.size());
  while (prefixBuffer) {
    int n = Exp::URI().Match(prefixBuffer);
    if (n <= 0) {
      return false;
    }

    while (--n >= 0) {
      out << prefixBuffer[0];
      ++prefixBuffer;
    }
  }

  out << "!";
  StringCharSource tagBuffer(tag.c_str(), tag.size());
  while (tagBuffer) {
    int n = Exp::Tag().Match(tagBuffer);
    if (n <= 0) {
      return false;
    }

    while (--n >= 0) {
      out << tagBuffer[0];
      ++tagBuffer;
    }
  }
  return true;
}